

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ListBox(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter
                   ,void *data,int items_count,int height_in_items)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int int_id;
  ImGuiContext *pIVar4;
  float items_height;
  char *item_text;
  ImGuiListClipper clipper;
  char *local_60;
  ImGuiContext *local_58;
  ImVec2 local_50;
  ImGuiListClipper local_48;
  
  bVar2 = ListBoxHeader(label,items_count,height_in_items);
  pIVar4 = GImGui;
  if (bVar2) {
    items_height = GetTextLineHeightWithSpacing();
    ImGuiListClipper::Begin(&local_48,items_count,items_height);
    bVar2 = ImGuiListClipper::Step(&local_48);
    if (bVar2) {
      local_58 = pIVar4;
      bVar2 = false;
      int_id = local_48.DisplayStart;
      do {
        for (; int_id < local_48.DisplayEnd; int_id = int_id + 1) {
          iVar1 = *current_item;
          bVar3 = (*items_getter)(data,int_id,&local_60);
          if (!bVar3) {
            local_60 = "*Unknown item*";
          }
          PushID(int_id);
          local_50.x = 0.0;
          local_50.y = 0.0;
          bVar3 = Selectable(local_60,int_id == iVar1,0,&local_50);
          if (bVar3) {
            *current_item = int_id;
            bVar2 = true;
          }
          if (int_id == iVar1) {
            SetItemDefaultFocus();
          }
          PopID();
        }
        bVar3 = ImGuiListClipper::Step(&local_48);
        pIVar4 = local_58;
        int_id = local_48.DisplayStart;
      } while (bVar3);
    }
    else {
      bVar2 = false;
    }
    ListBoxFooter();
    if (bVar2) {
      MarkItemEdited((pIVar4->CurrentWindow->DC).LastItemId);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::ListBox(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int height_in_items)
{
    if (!ListBoxHeader(label, items_count, height_in_items))
        return false;

    // Assume all items have even height (= 1 line of text). If you need items of different or variable sizes you can create a custom version of ListBox() in your code without using the clipper.
    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    ImGuiListClipper clipper(items_count, GetTextLineHeightWithSpacing()); // We know exactly our line height here so we pass it as a minor optimization, but generally you don't need to.
    while (clipper.Step())
        for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++)
        {
            const bool item_selected = (i == *current_item);
            const char* item_text;
            if (!items_getter(data, i, &item_text))
                item_text = "*Unknown item*";

            PushID(i);
            if (Selectable(item_text, item_selected))
            {
                *current_item = i;
                value_changed = true;
            }
            if (item_selected)
                SetItemDefaultFocus();
            PopID();
        }
    ListBoxFooter();
    if (value_changed)
        MarkItemEdited(g.CurrentWindow->DC.LastItemId);

    return value_changed;
}